

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_offset.c
# Opt level: O0

void roaring_add_offset_test(void **state_)

{
  long lVar1;
  roaring_bitmap_t *prVar2;
  long *in_RDI;
  int64_t offset;
  roaring_add_offset_test_case_t test;
  roaring_add_offset_test_state_t *state;
  int64_t in_stack_00000040;
  roaring_bitmap_t *in_stack_00000048;
  
  lVar1 = *in_RDI;
  prVar2 = roaring_bitmap_add_offset(in_stack_00000048,in_stack_00000040);
  *(roaring_bitmap_t **)(lVar1 + 0x28) = prVar2;
  assert_roaring_offset((roaring_bitmap_t *)test.values,(roaring_bitmap_t *)test.name,offset);
  prVar2 = roaring_bitmap_add_offset(in_stack_00000048,in_stack_00000040);
  *(roaring_bitmap_t **)(lVar1 + 0x30) = prVar2;
  assert_roaring_offset((roaring_bitmap_t *)test.values,(roaring_bitmap_t *)test.name,offset);
  prVar2 = roaring_bitmap_add_offset(in_stack_00000048,in_stack_00000040);
  *(roaring_bitmap_t **)(lVar1 + 0x38) = prVar2;
  assert_roaring_offset((roaring_bitmap_t *)test.values,(roaring_bitmap_t *)test.name,offset);
  prVar2 = roaring_bitmap_add_offset(in_stack_00000048,in_stack_00000040);
  *(roaring_bitmap_t **)(lVar1 + 0x40) = prVar2;
  assert_roaring_offset((roaring_bitmap_t *)test.values,(roaring_bitmap_t *)test.name,offset);
  return;
}

Assistant:

static void roaring_add_offset_test(void **state_) {
    roaring_add_offset_test_state_t *state =
        *(roaring_add_offset_test_state_t **)state_;
    roaring_add_offset_test_case_t test = state->test_case;
    int64_t offset = test.offset;

    state->forward = roaring_bitmap_add_offset(state->in, offset);
    assert_roaring_offset(state->in, state->forward, offset);

    state->back = roaring_bitmap_add_offset(state->forward, -offset);
    assert_roaring_offset(state->forward, state->back, -offset);

    state->neg_forward = roaring_bitmap_add_offset(state->in, -offset);
    assert_roaring_offset(state->in, state->neg_forward, -offset);

    state->neg_back = roaring_bitmap_add_offset(state->neg_forward, offset);
    assert_roaring_offset(state->neg_forward, state->neg_back, offset);
}